

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O0

SHA1 * __thiscall sha1::SHA1::reset(SHA1 *this)

{
  SHA1 *this_local;
  
  this->m_digest[0] = 0x67452301;
  this->m_digest[1] = 0xefcdab89;
  this->m_digest[2] = 0x98badcfe;
  this->m_digest[3] = 0x10325476;
  this->m_digest[4] = 0xc3d2e1f0;
  this->m_blockByteIndex = 0;
  this->m_byteCount = 0;
  return this;
}

Assistant:

SHA1 &reset() {
    m_digest[0] = 0x67452301;
    m_digest[1] = 0xEFCDAB89;
    m_digest[2] = 0x98BADCFE;
    m_digest[3] = 0x10325476;
    m_digest[4] = 0xC3D2E1F0;
    m_blockByteIndex = 0;
    m_byteCount = 0;
    return *this;
  }